

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O1

void __thiscall
helics::tcp::TcpComms::txReceive
          (TcpComms *this,char *data,size_t bytes_received,string *errorMessage)

{
  string_view message;
  ActionMessage m;
  ActionMessage local_c8;
  
  if (errorMessage->_M_string_length != 0) {
    message._M_str = (errorMessage->_M_dataplus)._M_p;
    message._M_len = errorMessage->_M_string_length;
    CommsInterface::logError((CommsInterface *)this,message);
    return;
  }
  ActionMessage::ActionMessage(&local_c8,data,bytes_received);
  if (((local_c8.messageAction == cmd_protocol_priority) ||
      (local_c8.messageAction == cmd_protocol_big)) || (local_c8.messageAction == cmd_protocol)) {
    gmlc::containers::
    BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
    ::emplace<helics::route_id_const&,helics::ActionMessage&>
              ((BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                *)&(this->super_NetworkCommsInterface).super_CommsInterface.txQueue,
               (route_id *)&control_route,&local_c8);
  }
  ActionMessage::~ActionMessage(&local_c8);
  return;
}

Assistant:

void TcpComms::txReceive(const char* data, size_t bytes_received, const std::string& errorMessage)
{
    if (errorMessage.empty()) {
        ActionMessage m(reinterpret_cast<const std::byte*>(data), bytes_received);
        if (isProtocolCommand(m)) {
            txQueue.emplace(control_route, m);
        }
    } else {
        logError(errorMessage);
    }
}